

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringCleanup_testZstrings_Test::~stringCleanup_testZstrings_Test
          (stringCleanup_testZstrings_Test *this)

{
  stringCleanup_testZstrings_Test *this_local;
  
  ~stringCleanup_testZstrings_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringCleanup, testZstrings)
{
    auto res = detail::testing::testCleanUpString("0.000000045lb", 0);
    EXPECT_EQ(res, "0.000000045lb");

    res = detail::testing::testCleanUpString("0.0000000000000045lb", 0);
    EXPECT_EQ(res, "0.0000000000000045lb");

    res = detail::testing::testCleanUpString("s*00.000000000000004lb", 0);
    EXPECT_EQ(res, "s*00.000000000000004lb");

    res = detail::testing::testCleanUpString("1.00000000000009lb", 0);
    EXPECT_EQ(res, "1lb");

    res = detail::testing::testCleanUpString("1.00000000000019lb", 0);
    EXPECT_EQ(res, "1.00000000000019lb");

    res = detail::testing::testCleanUpString("1.00000009000009lb", 0);
    EXPECT_EQ(res, "1.00000009lb");

    res = detail::testing::testCleanUpString("100000009000009lb", 0);
    EXPECT_EQ(res, "100000009000009lb");

    res = detail::testing::testCleanUpString("1.0000000000000lb", 0);
    EXPECT_EQ(res, "1lb");

    res = detail::testing::testCleanUpString("1.0000000000000", 0);
    EXPECT_EQ(res, "1");

    /** make sure it doesn't skip a multiplier*/
    res = detail::testing::testCleanUpString("1.0005*10000008*lb", 0);
    EXPECT_EQ(res, "1.0005*10000008*lb");

    res = detail::testing::testCleanUpString("n.000000000000000", 0);
    EXPECT_EQ(res, "n.000000000000000");

    res = detail::testing::testCleanUpString("1.0005*10000008", 0);
    EXPECT_EQ(res, "1.0005*10000008");

    res = detail::testing::testCleanUpString("1.0005*10000000", 0);
    EXPECT_EQ(res, "1.0005*10000000");

    res = detail::testing::testCleanUpString(".0000000000000000000000004lb", 0);
    EXPECT_EQ(res, ".0000000000000000000000004lb");
}